

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O3

void mask_print(FILE *out,uint32_t *mask,int size)

{
  ulong uVar1;
  
  if (0 < size) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        fputc(0x20,(FILE *)out);
      }
      fprintf((FILE *)out,"%08x",(ulong)mask[uVar1]);
      uVar1 = uVar1 + 1;
    } while (size + 0x1fU >> 5 != uVar1);
  }
  return;
}

Assistant:

void mask_print(FILE *out, uint32_t *mask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++) {
		if (i)
			fprintf(out, " ");
		fprintf (out, "%08"PRIx32, mask[i]);
	}
}